

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

void __thiscall wasm::ThreadPool::initialize(ThreadPool *this,size_t num)

{
  bool *__args;
  bool bVar1;
  undefined1 local_48 [8];
  unique_lock<std::mutex> lock;
  
  if (num != 1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_48,(mutex_type *)threadMutex);
    LOCK();
    (this->ready).super___atomic_base<unsigned_long>._M_i =
         (long)(this->threads).
               super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->threads).
               super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    UNLOCK();
    resetThreadsAreReady(this);
    __args = &lock._M_owns;
    while (bVar1 = num != 0, num = num - 1, bVar1) {
      std::make_unique<wasm::Thread,wasm::ThreadPool*>((ThreadPool **)__args);
      std::
      vector<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>,std::allocator<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>>
      ::emplace_back<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>
                ((vector<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>,std::allocator<std::unique_ptr<wasm::Thread,std::default_delete<wasm::Thread>>>>
                  *)this,(unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_> *)__args);
      std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>::~unique_ptr
                ((unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_> *)__args);
    }
    while ((this->ready).super___atomic_base<unsigned_long>._M_i !=
           (long)(this->threads).
                 super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->threads).
                 super__Vector_base<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>,_std::allocator<std::unique_ptr<wasm::Thread,_std::default_delete<wasm::Thread>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) {
      std::condition_variable::wait((unique_lock *)&this->condition);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
  }
  return;
}

Assistant:

void ThreadPool::initialize(size_t num) {
  if (num == 1) {
    return; // no multiple cores, don't create threads
  }
  DEBUG_POOL("initialize()\n");
  std::unique_lock<std::mutex> lock(threadMutex);
  // initial state before first resetThreadsAreReady()
  ready.store(threads.size());
  resetThreadsAreReady();
  for (size_t i = 0; i < num; i++) {
    try {
      threads.emplace_back(std::make_unique<Thread>(this));
    } catch (std::system_error&) {
      // failed to create a thread - don't use multithreading, as if num cores
      // == 1
      DEBUG_POOL("could not create thread\n");
      threads.clear();
      return;
    }
  }
  DEBUG_POOL("initialize() waiting\n");
  condition.wait(lock, [this]() { return areThreadsReady(); });
  DEBUG_POOL("initialize() is done\n");
}